

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_write_log(http_s *h)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  fio_lock_i fVar4;
  char cVar5;
  FIOBJ dest;
  uint64_t key_hash;
  FIOBJ FVar6;
  fiobj_object_vtable_s *pfVar7;
  undefined1 uVar8;
  uint uVar9;
  size_t len;
  char cVar10;
  char *data;
  ulong num;
  uint uVar11;
  fio_str_info_s buff;
  fio_lock_i ret_2;
  timespec end;
  fio_str_info_s local_78;
  fio_str_info_s local_58;
  timespec local_40;
  
  dest = fiobj_str_buf(0x80);
  FVar6 = (h->private_data).out_headers;
  key_hash = fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH);
  FVar6 = fiobj_hash_get2(FVar6,key_hash);
  if ((FVar6 & 1) == 0) {
    uVar9 = (uint)FVar6 & 6;
    if (FVar6 == 0 || uVar9 == 6) {
      num = (ulong)(FVar6 == 0x16);
    }
    else {
      switch(uVar9) {
      case 0:
        uVar8 = *(undefined1 *)(FVar6 & 0xfffffffffffffff8);
        break;
      case 2:
        uVar8 = 0x28;
        break;
      case 4:
        uVar8 = 0x2a;
        break;
      case 6:
        uVar8 = (undefined1)FVar6;
      }
      switch(uVar8) {
      case 0x27:
        pfVar7 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        pfVar7 = &FIOBJECT_VTABLE_STRING;
        break;
      case 0x29:
        pfVar7 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        pfVar7 = &FIOBJECT_VTABLE_HASH;
        break;
      case 0x2b:
        pfVar7 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar7 = &FIOBJECT_VTABLE_NUMBER;
      }
      num = (*pfVar7->to_i)(FVar6);
    }
  }
  else {
    num = FVar6 >> 1 & 0x3fffffffffffffff | (long)FVar6 >> 0x3f & 0xc000000000000000U;
  }
  clock_gettime(0,&local_40);
  lVar2 = (h->received_at).tv_sec;
  lVar3 = (h->received_at).tv_nsec;
  fio_peer_addr(&local_78,*(intptr_t *)((h->private_data).flag + 0x30));
  fiobj_str_write(dest,local_78.data,local_78.len);
  cVar10 = (char)dest;
  uVar9 = (uint)dest;
  if (dest == 0) {
LAB_0014d65d:
    local_78.data = anon_var_dwarf_20f;
    uVar11 = 4;
    goto LAB_0014d670;
  }
  if ((dest & 1) == 0) {
    cVar5 = '(';
    switch(uVar9 & 6) {
    case 0:
switchD_0014d693_caseD_0:
      cVar5 = *(char *)(dest & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0014d693_caseD_4:
      cVar5 = '*';
      break;
    case 6:
      if (cVar10 == '&') {
        local_78.data = anon_var_dwarf_21a;
        uVar11 = 5;
      }
      else {
        if ((uVar9 & 0xff) != 0x16) {
          if ((uVar9 & 0xff) == 6) goto LAB_0014d65d;
          switch(uVar9 & 6) {
          case 0:
            goto switchD_0014d693_caseD_0;
          case 4:
            goto switchD_0014d693_caseD_4;
          case 6:
            cVar5 = cVar10;
          }
          break;
        }
        local_78.data = anon_var_dwarf_225;
        uVar11 = 4;
      }
LAB_0014d670:
      local_78.capa = 0;
      local_78.len = (size_t)uVar11;
      goto LAB_0014d737;
    }
    switch(cVar5) {
    case '\'':
      pfVar7 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar7 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar7 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar7 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar7 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar7 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar7->to_str)(&local_78,dest);
  }
  else {
    fio_ltocstr(&local_78,(long)dest >> 1);
  }
LAB_0014d737:
  if (local_78.len == 0) {
    builtin_strncpy(local_78.data,"[unknown]",9);
    local_78.len = 9;
  }
  builtin_strncpy(local_78.data + local_78.len," - - [",6);
  local_78.len = local_78.len + 6;
  fiobj_str_resize(dest,local_78.len);
  LOCK();
  UNLOCK();
  if (date_lock != '\0') {
    do {
      date_lock = '\x01';
      local_58.capa = 0;
      local_58.len = 1;
      nanosleep((timespec *)&local_58,(timespec *)0x0);
      LOCK();
      UNLOCK();
    } while (date_lock != '\0');
  }
  FVar6 = current_date;
  date_lock = '\x01';
  if ((((~(uint)current_date & 6) != 0) && (current_date != 0)) && ((current_date & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((current_date & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  fVar4 = date_lock;
  LOCK();
  date_lock = '\0';
  UNLOCK();
  local_58.capa = CONCAT71(local_58.capa._1_7_,fVar4);
  fiobj_str_concat(dest,current_date);
  fiobj_free(FVar6);
  fiobj_str_write(dest,"] \"",3);
  fiobj_str_concat(dest,h->method);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->path);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->version);
  fiobj_str_write(dest,"\" ",2);
  if ((long)num < 1) {
    FVar6 = fiobj_num_tmp(h->status);
    fiobj_str_concat(dest,FVar6);
    data = " -- ";
    len = 4;
  }
  else {
    fiobj_str_write_i(dest,h->status);
    fiobj_str_write(dest," ",1);
    fiobj_str_write_i(dest,num);
    data = "b ";
    len = 2;
  }
  fiobj_str_write(dest,data,len);
  fiobj_str_write_i(dest,(local_40.tv_nsec - lVar3) / 1000000 + (local_40.tv_sec - lVar2) * 1000);
  fiobj_str_write(dest,"ms\r\n",4);
  if (dest == 0) {
LAB_0014d94a:
    local_58.data = anon_var_dwarf_20f;
    uVar9 = 4;
    goto LAB_0014d95d;
  }
  if ((dest & 1) != 0) {
    fio_ltocstr(&local_58,(long)dest >> 1);
    goto LAB_0014da29;
  }
  cVar5 = '(';
  switch(uVar9 & 6) {
  case 0:
switchD_0014d981_caseD_0:
    cVar5 = *(char *)(dest & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0014d981_caseD_4:
    cVar5 = '*';
    break;
  case 6:
    if (cVar10 == '&') {
      local_58.data = anon_var_dwarf_21a;
      uVar9 = 5;
    }
    else {
      if ((uVar9 & 0xff) != 0x16) {
        if ((uVar9 & 0xff) == 6) goto LAB_0014d94a;
        switch(uVar9 & 6) {
        case 0:
          goto switchD_0014d981_caseD_0;
        case 4:
          goto switchD_0014d981_caseD_4;
        case 6:
          cVar5 = cVar10;
        }
        break;
      }
      local_58.data = anon_var_dwarf_225;
      uVar9 = 4;
    }
LAB_0014d95d:
    local_58.capa = 0;
    local_58.len = (size_t)uVar9;
    goto LAB_0014da29;
  }
  switch(cVar5) {
  case '\'':
    pfVar7 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar7 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar7 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar7 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar7 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar7 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar7->to_str)(&local_58,dest);
LAB_0014da29:
  local_78.data = local_58.data;
  local_78.capa = local_58.capa;
  local_78.len = local_58.len;
  fwrite(local_58.data,1,local_58.len,_stderr);
  fiobj_free(dest);
  return;
}

Assistant:

void http_write_log(http_s *h) {
  FIOBJ l = fiobj_str_buf(128);

  intptr_t bytes_sent = fiobj_obj2num(fiobj_hash_get2(
      h->private_data.out_headers, fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH)));

  struct timespec start, end;
  clock_gettime(CLOCK_REALTIME, &end);
  start = h->received_at;

  {
    // TODO Guess IP address from headers (forwarded) where possible
    fio_str_info_s peer = fio_peer_addr(http2protocol(h)->uuid);
    fiobj_str_write(l, peer.data, peer.len);
  }
  fio_str_info_s buff = fiobj_obj2cstr(l);

  if (buff.len == 0) {
    memcpy(buff.data, "[unknown]", 9);
    buff.len = 9;
  }
  memcpy(buff.data + buff.len, " - - [", 6);
  buff.len += 6;
  fiobj_str_resize(l, buff.len);
  {
    FIOBJ date;
    fio_lock(&date_lock);
    date = fiobj_dup(current_date);
    fio_unlock(&date_lock);
    fiobj_str_join(l, current_date);
    fiobj_free(date);
  }
  fiobj_str_write(l, "] \"", 3);
  fiobj_str_join(l, h->method);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->path);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->version);
  fiobj_str_write(l, "\" ", 2);
  if (bytes_sent > 0) {
    fiobj_str_write_i(l, h->status);
    fiobj_str_write(l, " ", 1);
    fiobj_str_write_i(l, bytes_sent);
    fiobj_str_write(l, "b ", 2);
  } else {
    fiobj_str_join(l, fiobj_num_tmp(h->status));
    fiobj_str_write(l, " -- ", 4);
  }

  bytes_sent = ((end.tv_sec - start.tv_sec) * 1000) +
               ((end.tv_nsec - start.tv_nsec) / 1000000);
  fiobj_str_write_i(l, bytes_sent);
  fiobj_str_write(l, "ms\r\n", 4);

  buff = fiobj_obj2cstr(l);
  fwrite(buff.data, 1, buff.len, stderr);
  fiobj_free(l);
}